

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<Fad<double>_>::AddSub
          (TPZMatrix<Fad<double>_> *this,int64_t sRow,int64_t sCol,TPZFMatrix<Fad<double>_> *A)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  double *pdVar5;
  int sz;
  int64_t iVar6;
  double *pdVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long local_c8;
  Fad<double> local_b8;
  int64_t local_98;
  long local_90;
  TPZMatrix<Fad<double>_> *local_88;
  TPZFMatrix<Fad<double>_> *local_80;
  long local_78;
  Fad<double> local_70;
  Fad<double> local_50;
  
  local_90 = (this->super_TPZBaseMatrix).fRow - sRow;
  lVar8 = (A->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  lVar10 = (A->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
  if (lVar8 < local_90) {
    local_90 = lVar8;
  }
  lVar8 = (this->super_TPZBaseMatrix).fCol - sCol;
  if (lVar10 < lVar8) {
    lVar8 = lVar10;
  }
  if (0 < local_90) {
    local_c8 = 0;
    local_98 = sCol;
    local_88 = this;
    local_80 = A;
    do {
      if (0 < lVar8) {
        lVar10 = 0;
        iVar6 = local_98;
        local_78 = sRow;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_50,this,sRow,iVar6);
          (*(local_80->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(&local_70,local_80,local_c8);
          iVar3 = local_50.dx_.num_elts;
          iVar2 = local_70.dx_.num_elts;
          local_b8.val_ = local_50.val_ + local_70.val_;
          uVar1 = local_70.dx_.num_elts;
          if (local_70.dx_.num_elts < local_50.dx_.num_elts) {
            uVar1 = local_50.dx_.num_elts;
          }
          local_b8.dx_.num_elts = 0;
          local_b8.dx_.ptr_to_data = (double *)0x0;
          if (0 < (int)uVar1) {
            uVar9 = (ulong)uVar1;
            local_b8.dx_.num_elts = uVar1;
            local_b8.dx_.ptr_to_data = (double *)operator_new__(uVar9 * 8);
            if (0 < (int)uVar1) {
              lVar4 = 0;
              do {
                pdVar5 = (double *)((long)local_50.dx_.ptr_to_data + lVar4);
                if (iVar3 == 0) {
                  pdVar5 = &local_50.defaultVal;
                }
                pdVar7 = (double *)((long)local_70.dx_.ptr_to_data + lVar4);
                if (iVar2 == 0) {
                  pdVar7 = &local_70.defaultVal;
                }
                *(double *)((long)local_b8.dx_.ptr_to_data + lVar4) = *pdVar5 + *pdVar7;
                lVar4 = lVar4 + 8;
                uVar9 = uVar9 - 1;
              } while (uVar9 != 0);
            }
          }
          sRow = local_78;
          this = local_88;
          local_b8.defaultVal = 0.0;
          (*(local_88->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (local_88,local_78,iVar6,&local_b8);
          Fad<double>::~Fad(&local_b8);
          Fad<double>::~Fad(&local_70);
          Fad<double>::~Fad(&local_50);
          lVar10 = lVar10 + 1;
          iVar6 = iVar6 + 1;
        } while (lVar10 != lVar8);
      }
      local_c8 = local_c8 + 1;
      sRow = sRow + 1;
    } while (local_c8 != local_90);
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::AddSub(const int64_t sRow,const int64_t sCol,const TPZFMatrix<TVar> &A ) {
	
    int64_t minRow = MIN( A.Rows(), Rows() - sRow );
    int64_t minCol = MIN( A.Cols(), Cols() - sCol );
	//  REAL v;
	
	int64_t row = sRow;
    for ( int64_t r = 0; r < minRow; r++, row++ ) {
        int64_t col = sCol;
        for ( int64_t c = 0; c < minCol; c++, col++ ) {
            PutVal( row, col, GetVal( row, col ) + A.GetVal( r, c ) );
        }
    }
    return( 1 );
}